

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::ConvertToSampledImagePass::CreateImageExtraction
          (ConvertToSampledImagePass *this,Instruction *sampled_image)

{
  IRContext *this_00;
  IRContext *this_01;
  TypeManager *this_02;
  uint32_t uVar1;
  int iVar2;
  uint32_t operand1;
  Type *pTVar3;
  undefined4 extraout_var;
  Instruction *pIVar4;
  iterator instr;
  InstructionBuilder builder;
  InstructionBuilder local_50;
  
  pIVar4 = (sampled_image->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  uVar1 = 0;
  this_00 = (this->super_Pass).context_;
  instr.node_ = (Instruction *)0x0;
  if ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
    instr.node_ = pIVar4;
  }
  local_50.parent_ = IRContext::get_instr_block(this_00,instr.node_);
  local_50.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  this_01 = (this->super_Pass).context_;
  local_50.context_ = this_00;
  local_50.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
  if ((this_01->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_01);
  }
  this_02 = (this_01->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if (sampled_image->has_type_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(sampled_image,0);
  }
  pTVar3 = analysis::TypeManager::GetType(this_02,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[0x15])(pTVar3);
  uVar1 = analysis::TypeManager::GetTypeInstruction
                    (this_02,*(Type **)(CONCAT44(extraout_var,iVar2) + 0x28));
  operand1 = 0;
  if (sampled_image->has_result_id_ == true) {
    operand1 = Instruction::GetSingleWordOperand(sampled_image,(uint)sampled_image->has_type_id_);
  }
  pIVar4 = InstructionBuilder::AddUnaryOp(&local_50,uVar1,OpImage,operand1);
  return pIVar4;
}

Assistant:

Instruction* ConvertToSampledImagePass::CreateImageExtraction(
    Instruction* sampled_image) {
  InstructionBuilder builder(
      context(), sampled_image->NextNode(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  return builder.AddUnaryOp(
      GetImageTypeOfSampledImage(context()->get_type_mgr(), sampled_image),
      spv::Op::OpImage, sampled_image->result_id());
}